

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall asl::String::trim(String *this)

{
  size_t __n;
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  
  uVar7 = this->_len;
  lVar2 = (long)(int)uVar7;
  if (this->_size == 0) {
    __dest = &this->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar7) {
    uVar4 = (ulong)uVar7;
  }
  do {
    if (uVar4 == uVar6) {
LAB_00121356:
      uVar3 = (uint)uVar4;
      uVar5 = uVar7;
      if ((int)uVar3 < (int)uVar7) {
        uVar5 = uVar3;
      }
      while (((uVar7 = uVar7 - 1, uVar8 = uVar5 - 1, (int)uVar3 < lVar2 &&
              (bVar1 = __dest->_space[lVar2 + -1], uVar8 = uVar7, (char)bVar1 < '!')) &&
             ((bVar1 < 0x21 && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))))) {
        lVar2 = lVar2 + -1;
      }
      __n = (long)(int)(uVar8 - uVar3) + 1;
      memmove(__dest,(char *)((long)__dest + (long)(int)uVar3),__n);
      __dest->_space[(long)(int)(uVar8 - uVar3) + 1] = '\0';
      this->_len = (int)__n;
      return this;
    }
    bVar1 = __dest->_space[uVar6];
    if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
       ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      uVar4 = uVar6 & 0xffffffff;
      goto LAB_00121356;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

String& String::trim()
{
	int i, j, n = _len;
	char* s = str();
	for (i = 0; i<n; i++)
		if (!myisspace(s[i])) break;
	for (j = n - 1; j >= i; j--)
		if (!myisspace(s[j])) break;
	memmove(s, s + i, j - i + 1);
	s[j - i + 1] = '\0';
	_len = j - i + 1;
	return *this;
}